

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfl_avx2.c
# Opt level: O2

void cfl_luma_subsampling_444_lbd_avx2
               (uint8_t *input,int input_stride,uint16_t *pred_buf_q3,int width,int height)

{
  undefined1 auVar1 [32];
  undefined1 (*pauVar2) [32];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  
  pauVar2 = (undefined1 (*) [32])(pred_buf_q3 + (ulong)(uint)(width * 2) * 0x10);
  do {
    auVar1 = vpermq_avx2(*(undefined1 (*) [32])input,0xd8);
    auVar3 = vpmovzxbw_avx2(*(undefined1 (*) [16])*(undefined1 (*) [32])input);
    auVar1 = vpunpckhbw_avx2(auVar1,SUB6432(ZEXT1664((undefined1  [16])0x0),0));
    auVar4 = vpsllw_avx2(auVar3,3);
    auVar3 = vpsllw_avx2(auVar1,3);
    *(undefined1 (*) [32])pred_buf_q3 = auVar4;
    *(undefined1 (*) [32])((long)pred_buf_q3 + 0x20) = auVar3;
    input = *(undefined1 (*) [32])input + input_stride;
    pred_buf_q3 = (uint16_t *)((long)pred_buf_q3 + 0x40);
  } while (pred_buf_q3 < pauVar2);
  return;
}

Assistant:

static void cfl_luma_subsampling_444_lbd_avx2(const uint8_t *input,
                                              int input_stride,
                                              uint16_t *pred_buf_q3, int width,
                                              int height) {
  (void)width;  // Forever 32
  __m256i *row = (__m256i *)pred_buf_q3;
  const __m256i *row_end = row + height * CFL_BUF_LINE_I256;
  const __m256i zeros = _mm256_setzero_si256();
  do {
    __m256i top = _mm256_loadu_si256((__m256i *)input);
    top = _mm256_permute4x64_epi64(top, _MM_SHUFFLE(3, 1, 2, 0));

    __m256i row_lo = _mm256_unpacklo_epi8(top, zeros);
    row_lo = _mm256_slli_epi16(row_lo, 3);
    __m256i row_hi = _mm256_unpackhi_epi8(top, zeros);
    row_hi = _mm256_slli_epi16(row_hi, 3);

    _mm256_storeu_si256(row, row_lo);
    _mm256_storeu_si256(row + 1, row_hi);

    input += input_stride;
  } while ((row += CFL_BUF_LINE_I256) < row_end);
}